

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void __thiscall rsg::VariableValue::VariableValue(VariableValue *this,VariableValue *other)

{
  VariableType *pVVar1;
  ConstStridedValueAccess<1> local_58 [2];
  ConstValueAccess local_38;
  StridedValueRead<1> local_28;
  VariableValue *local_18;
  VariableValue *other_local;
  VariableValue *this_local;
  
  this->m_variable = other->m_variable;
  local_18 = other;
  other_local = this;
  pVVar1 = rsg::Variable::getType(other->m_variable);
  ValueStorage<1>::ValueStorage(&this->m_storage,pVVar1);
  local_38 = getValue(local_18);
  local_28 = ConstStridedValueAccess<1>::value(&local_38);
  pVVar1 = getType(this);
  local_58[0] = (ConstStridedValueAccess<1>)ValueStorage<1>::getValue(&this->m_storage,pVVar1);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_58,&local_28);
  return;
}

Assistant:

VariableValue::VariableValue (const VariableValue& other)
	: m_variable(other.m_variable)
	, m_storage(other.m_variable->getType())
{
	m_storage.getValue(getType()) = other.getValue().value();
}